

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_lines.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::split_lines<false,11>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char (*s_) [11])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *a_;
  size_t sVar2;
  size_t in_RCX;
  char *s__00;
  char *s__01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s__02;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  *c_;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__00;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__01;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__02;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> *c__03;
  basic_file_view<false> *c__04;
  string path;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view5;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view4;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view3;
  basic_view<std::basic_istream<char,_std::char_traits<char>_>,_false> view2;
  basic_view<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  view1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v2;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v12;
  directory tmp;
  basic_file_view<false> view6;
  ifstream fs2;
  istringstream s3;
  ifstream fs1;
  istringstream s2;
  istringstream s1;
  ifstream fs3;
  long *local_eb0;
  long local_ea8;
  long local_ea0 [2];
  assert_equal_container local_e90;
  string local_e68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e48;
  long **local_e40;
  istringstream *local_e38;
  output_file *local_e30;
  istringstream *local_e28;
  string *local_e20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_de8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_dd0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_db8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_da0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d88;
  type local_d70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d58;
  long *local_d40 [2];
  long local_d30 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d08;
  directory local_cf0;
  long *local_cd0 [2];
  long local_cc0 [63];
  long *local_ac8;
  void *local_ac0;
  long local_ab8 [63];
  istringstream local_8c0 [120];
  ios_base local_848 [264];
  output_file local_740 [13];
  istringstream local_538 [120];
  ios_base local_4c0 [264];
  istringstream local_3b8 [120];
  ios_base local_340 [264];
  istream local_238 [520];
  
  just::temp::directory::directory(&local_cf0);
  local_e68._M_dataplus._M_p = (pointer)&local_e68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e68,local_cf0._path._M_dataplus._M_p,
             local_cf0._path._M_dataplus._M_p + local_cf0._path._M_string_length);
  std::__cxx11::string::append((char *)&local_e68);
  local_ac8 = local_ab8;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac8,this,this + sVar2);
  just::file::impl::output_file::output_file(local_740,&local_e68);
  just::file::impl::output_file::write(local_740,(int)local_ac8,local_ac0,in_RCX);
  just::file::impl::output_file::~output_file(local_740);
  if (local_ac8 != local_ab8) {
    operator_delete(local_ac8,local_ab8[0] + 1);
  }
  local_e48 = __return_storage_ptr__;
  std::ifstream::ifstream(local_740,local_e68._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(&local_ac8,local_e68._M_dataplus._M_p,_S_in|_S_bin);
  std::ifstream::ifstream(local_238,local_e68._M_dataplus._M_p,_S_in|_S_bin);
  local_cd0[0] = local_cc0;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd0,this,this + sVar2);
  std::__cxx11::istringstream::istringstream(local_3b8,(string *)local_cd0,_S_in);
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0],local_cc0[0] + 1);
  }
  local_cd0[0] = local_cc0;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd0,this,this + sVar2);
  std::__cxx11::istringstream::istringstream(local_538,(string *)local_cd0,_S_in);
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0],local_cc0[0] + 1);
  }
  local_cd0[0] = local_cc0;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_cd0,this,this + sVar2);
  std::__cxx11::istringstream::istringstream(local_8c0,(string *)local_cd0,_S_in);
  if (local_cd0[0] != local_cc0) {
    operator_delete(local_cd0[0],local_cc0[0] + 1);
  }
  local_d40[0] = local_d30;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d40,this,this + sVar2);
  local_e30 = local_740;
  local_e40 = &local_ac8;
  local_e38 = local_538;
  local_e28 = local_3b8;
  local_e20 = (string *)local_d40;
  std::ifstream::ifstream(local_cd0,local_e68._M_dataplus._M_p,_S_in|_S_bin);
  a_ = local_e48;
  just::lines::split<false,char_const>(local_e48,(lines *)this,s__00);
  just::lines::split<false,char_const>(&local_d58,(lines *)this,s__01);
  paVar1 = &local_e90._assert_msg._filename.field_2;
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e90,this,this + sVar2);
  just::lines::split<false,std::__cxx11::string>(&local_d70,(lines *)&local_e90,s__02);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  just::lines::split<false>(&local_d88,(istream *)local_8c0);
  just::lines::split<false>(&local_da0,local_238);
  just::lines::split_lines_of_file<false>(&local_db8,&local_e68);
  create_vector<just::lines::basic_view<std::__cxx11::string,false>>
            (&local_dd0,(_anonymous_namespace_ *)&local_e20,c_);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&local_de8,(_anonymous_namespace_ *)&local_e28,c__00);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e00,(_anonymous_namespace_ *)&local_e30,c__01);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&local_e18,(_anonymous_namespace_ *)&local_e38,c__02);
  create_vector<just::lines::basic_view<std::istream,false>>
            (&local_d20,(_anonymous_namespace_ *)&local_e40,c__03);
  create_vector<just::lines::basic_file_view<false>>
            (&local_d08,(_anonymous_namespace_ *)local_cd0,c__04);
  local_eb0 = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_eb0,local_ea8 + (long)local_eb0);
  local_e90._assert_msg._line = 0x57;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,a_,&local_d58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0 != local_ea0) {
    operator_delete(local_eb0,local_ea0[0] + 1);
  }
  local_eb0 = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_eb0,local_ea8 + (long)local_eb0);
  local_e90._assert_msg._line = 0x58;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&local_d58,&local_d70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0 != local_ea0) {
    operator_delete(local_eb0,local_ea0[0] + 1);
  }
  local_eb0 = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_eb0,local_ea8 + (long)local_eb0);
  local_e90._assert_msg._line = 0x59;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&local_d70,&local_d88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0 != local_ea0) {
    operator_delete(local_eb0,local_ea0[0] + 1);
  }
  local_eb0 = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_eb0,local_ea8 + (long)local_eb0);
  local_e90._assert_msg._line = 0x5a;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&local_d88,&local_da0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0 != local_ea0) {
    operator_delete(local_eb0,local_ea0[0] + 1);
  }
  local_eb0 = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_eb0,local_ea8 + (long)local_eb0);
  local_e90._assert_msg._line = 0x5b;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&local_da0,&local_db8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0 != local_ea0) {
    operator_delete(local_eb0,local_ea0[0] + 1);
  }
  local_eb0 = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_eb0,local_ea8 + (long)local_eb0);
  local_e90._assert_msg._line = 0x5c;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&local_db8,&local_dd0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0 != local_ea0) {
    operator_delete(local_eb0,local_ea0[0] + 1);
  }
  local_eb0 = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_eb0,local_ea8 + (long)local_eb0);
  local_e90._assert_msg._line = 0x5d;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&local_dd0,&local_de8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0 != local_ea0) {
    operator_delete(local_eb0,local_ea0[0] + 1);
  }
  local_eb0 = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_eb0,local_ea8 + (long)local_eb0);
  local_e90._assert_msg._line = 0x5e;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&local_de8,&local_e00);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0 != local_ea0) {
    operator_delete(local_eb0,local_ea0[0] + 1);
  }
  local_eb0 = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_eb0,local_ea8 + (long)local_eb0);
  local_e90._assert_msg._line = 0x5f;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&local_e00,&local_e18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0 != local_ea0) {
    operator_delete(local_eb0,local_ea0[0] + 1);
  }
  local_eb0 = local_ea0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_eb0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/libs/lines/test/test_lines.cpp"
             ,"");
  local_e90._assert_msg._filename._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e90,local_eb0,local_ea8 + (long)local_eb0);
  local_e90._assert_msg._line = 0x60;
  just::test::assert_equal_container::
  run<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (&local_e90,&local_e18,&local_d20);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e90._assert_msg._filename._M_dataplus._M_p != paVar1) {
    operator_delete(local_e90._assert_msg._filename._M_dataplus._M_p,
                    local_e90._assert_msg._filename.field_2._M_allocated_capacity + 1);
  }
  if (local_eb0 != local_ea0) {
    operator_delete(local_eb0,local_ea0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d08);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_de8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_dd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_db8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_da0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d58);
  std::ifstream::~ifstream(local_cd0);
  if (local_d40[0] != local_d30) {
    operator_delete(local_d40[0],local_d30[0] + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_8c0);
  std::ios_base::~ios_base(local_848);
  std::__cxx11::istringstream::~istringstream(local_538);
  std::ios_base::~ios_base(local_4c0);
  std::__cxx11::istringstream::~istringstream(local_3b8);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(local_238);
  std::ifstream::~ifstream(&local_ac8);
  std::ifstream::~ifstream(local_740);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e68._M_dataplus._M_p != &local_e68.field_2) {
    operator_delete(local_e68._M_dataplus._M_p,local_e68.field_2._M_allocated_capacity + 1);
  }
  just::temp::directory::~directory(&local_cf0);
  return a_;
}

Assistant:

std::vector<std::string> split_lines(const char (&s_)[N])
  {
    using std::vector;
    using std::string;

    just::temp::directory tmp;
    const std::string path = tmp.path() + "/test";
    just::file::write(path, s_);

    std::ifstream fs1(path.c_str(), std::ios_base::binary | std::ios_base::in);
    std::ifstream fs2(path.c_str(), std::ios_base::binary | std::ios_base::in);
    std::ifstream fs3(path.c_str(), std::ios_base::binary | std::ios_base::in);

    std::istringstream s1(s_);
    std::istringstream s2(s_);
    std::istringstream s3(s_);

    const std::string str(s_);
    const just::lines::basic_view<string, KeepNewlines> view1(str);
    just::lines::basic_view<std::istream, KeepNewlines> view2(s1);
    just::lines::basic_view<std::istream, KeepNewlines> view3(fs1);

    just::lines::basic_view<std::istream, KeepNewlines> view4(s2);
    just::lines::basic_view<std::istream, KeepNewlines> view5(fs2);
    just::lines::basic_file_view<KeepNewlines> view6(path);

    converts_to<just::lines::basic_view<std::istream, KeepNewlines> >(view6);

    const vector<string> v1 = just::lines::split<KeepNewlines>(s_);
    const vector<string> v2 = just::lines::split<KeepNewlines>(&(s_[0]));
    const vector<string> v3 = just::lines::split<KeepNewlines>(string(s_));
    const vector<string> v4 = just::lines::split<KeepNewlines>(s3);
    const vector<string> v5 = just::lines::split<KeepNewlines>(fs3);
    const vector<string> v6 =
      just::lines::split_lines_of_file<KeepNewlines>(path);
    const vector<string> v7 = create_vector(view1);
    const vector<string> v8 = create_vector(view2);
    const vector<string> v9 = create_vector(view3);
    const vector<string> v10 = create_vector(view4);
    const vector<string> v11 = create_vector(view5);
    const vector<string> v12 = create_vector(view6);
    JUST_ASSERT_EQUAL_CONTAINER(v1, v2);
    JUST_ASSERT_EQUAL_CONTAINER(v2, v3);
    JUST_ASSERT_EQUAL_CONTAINER(v3, v4);
    JUST_ASSERT_EQUAL_CONTAINER(v4, v5);
    JUST_ASSERT_EQUAL_CONTAINER(v5, v6);
    JUST_ASSERT_EQUAL_CONTAINER(v6, v7);
    JUST_ASSERT_EQUAL_CONTAINER(v7, v8);
    JUST_ASSERT_EQUAL_CONTAINER(v8, v9);
    JUST_ASSERT_EQUAL_CONTAINER(v9, v10);
    JUST_ASSERT_EQUAL_CONTAINER(v10, v11);

    return v1;
  }